

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
          (btAlignedObjectArray<btConvexHullInternal::Vertex_*> *this,Vertex **_Val)

{
  int iVar1;
  Vertex **ppVVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = this->m_size;
  if (iVar1 == this->m_capacity) {
    iVar4 = 1;
    if (iVar1 != 0) {
      iVar4 = iVar1 * 2;
    }
    if (this->m_capacity < iVar4) {
      if (iVar4 == 0) {
        ppVVar2 = (Vertex **)0x0;
      }
      else {
        ppVVar2 = (Vertex **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
      }
      iVar1 = this->m_size;
      if (0 < (long)iVar1) {
        lVar3 = 0;
        do {
          ppVVar2[lVar3] = this->m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (iVar1 != lVar3);
      }
      if (this->m_data != (Vertex **)0x0) {
        if (this->m_ownsMemory == true) {
          btAlignedFreeInternal(this->m_data);
        }
        this->m_data = (Vertex **)0x0;
      }
      this->m_ownsMemory = true;
      this->m_data = ppVVar2;
      this->m_capacity = iVar4;
    }
  }
  iVar1 = this->m_size;
  this->m_data[iVar1] = *_Val;
  this->m_size = iVar1 + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}